

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::ScriptOperator::ScriptOperator(ScriptOperator *this,ScriptType data_type)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  ScriptOperator(this,data_type,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

ScriptOperator::ScriptOperator(ScriptType data_type)
    : ScriptOperator(data_type, "") {
  // do nothing
}